

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O1

Stream * rw::readHAnim(Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  int32 iVar1;
  uint numNodes;
  int32 maxKeySize;
  int32 iVar2;
  int32 *nodeFlags;
  int32 *nodeIDs;
  HAnimHierarchy *pHVar3;
  ulong uVar4;
  
  Stream::readI32(stream);
  iVar1 = Stream::readI32(stream);
  *(int32 *)((long)object + (long)offset) = iVar1;
  numNodes = Stream::readI32(stream);
  if (numNodes != 0) {
    iVar1 = Stream::readI32(stream);
    maxKeySize = Stream::readI32(stream);
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp line: 266"
    ;
    nodeFlags = (int32 *)(*DAT_00148858)((long)(int)numNodes << 2,0x1011e);
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp line: 268"
    ;
    nodeIDs = (int32 *)(*DAT_00148858)((long)(int)numNodes << 2,0x1011e);
    if (0 < (int)numNodes) {
      uVar4 = 0;
      do {
        iVar2 = Stream::readI32(stream);
        nodeIDs[uVar4] = iVar2;
        Stream::readI32(stream);
        iVar2 = Stream::readI32(stream);
        nodeFlags[uVar4] = iVar2;
        uVar4 = uVar4 + 1;
      } while (numNodes != uVar4);
    }
    pHVar3 = HAnimHierarchy::create(numNodes,nodeFlags,nodeIDs,iVar1,maxKeySize);
    *(HAnimHierarchy **)((long)object + (long)offset + 8) = pHVar3;
    pHVar3->parentFrame = (Frame *)object;
    (*DAT_00148850)(nodeFlags);
    (*DAT_00148850)(nodeIDs);
  }
  return stream;
}

Assistant:

static Stream*
readHAnim(Stream *stream, int32, void *object, int32 offset, int32)
{
	int32 ver, numNodes;
	HAnimData *hanim = PLUGINOFFSET(HAnimData, object, offset);
	ver = stream->readI32();
	assert(ver == 0x100);
	hanim->id = stream->readI32();
	numNodes = stream->readI32();
	if(numNodes != 0){
		int32 flags = stream->readI32();
		int32 maxKeySize = stream->readI32();
		// Sizes are fucked for 64 bit pointers but
		// AnimInterpolator::create() will take care of that
		int32 *nodeFlags = rwNewT(int32, numNodes,
			MEMDUR_FUNCTION | ID_HANIM);
		int32 *nodeIDs = rwNewT(int32, numNodes,
			MEMDUR_FUNCTION | ID_HANIM);
		for(int32 i = 0; i < numNodes; i++){
			nodeIDs[i] = stream->readI32();
			stream->readI32();	// index...unused
			nodeFlags[i] = stream->readI32();
		}
		hanim->hierarchy = HAnimHierarchy::create(numNodes,
			nodeFlags, nodeIDs, flags, maxKeySize);
		hanim->hierarchy->parentFrame = (Frame*)object;
		rwFree(nodeFlags);
		rwFree(nodeIDs);
	}
	return stream;
}